

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

void stbiw__write_hdr_scanline(FILE *f,int width,int comp,uchar *scratch,float *scanline)

{
  FILE *f_00;
  FILE *f_01;
  uchar *puVar1;
  long lVar2;
  long lVar3;
  uchar *puVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  char local_90 [4];
  char local_8c [4];
  FILE *local_88;
  ulong local_80;
  uchar *local_78;
  uchar *local_70;
  undefined4 local_64;
  float fStack_60;
  uchar scanlineheader [4];
  long local_58;
  float local_50;
  float local_48;
  float local_40;
  undefined4 local_34;
  uchar rgbe [4];
  
  local_64 = CONCAT22((ushort)width << 8 | (ushort)width >> 8,0x202);
  local_88 = (FILE *)f;
  local_70 = scratch;
  if (width - 0x8000U < 0xffff8008) {
    if (0 < width) {
      uVar9 = (ulong)(uint)width;
      do {
        if (comp - 1U < 2) {
          local_40 = *scanline;
          local_50 = local_40;
          local_48 = local_40;
        }
        else if (comp - 3U < 2) {
          local_40 = *scanline;
          local_50 = scanline[1];
          local_48 = scanline[2];
        }
        fVar12 = local_50;
        if (local_50 <= local_48) {
          fVar12 = local_48;
        }
        fVar13 = local_40;
        if (local_40 <= fVar12) {
          fVar13 = fVar12;
        }
        if (1e-32 <= fVar13) {
          _fStack_60 = CONCAT44(scanlineheader,fVar13);
          fVar12 = frexpf(fVar13,(int *)local_8c);
          fVar12 = (fVar12 * 256.0) / fStack_60;
          local_34 = CONCAT13(local_8c[0] + -0x80,
                              CONCAT12((char)(int)(fVar12 * local_48),
                                       CONCAT11((char)(int)(local_50 * fVar12),
                                                (char)(int)(local_40 * fVar12))));
        }
        else {
          local_34 = 0;
        }
        fwrite(&local_34,4,1,local_88);
        scanline = scanline + comp;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  else {
    uVar5 = (ulong)(uint)width;
    uVar9 = uVar5;
    local_80 = uVar5;
    if (0 < width) {
      uVar10 = 0;
      do {
        if (comp - 1U < 2) {
          in_XMM2_Da = *scanline;
          in_XMM3_Da = in_XMM2_Da;
          in_XMM4_Da = in_XMM2_Da;
        }
        else if (comp - 3U < 2) {
          in_XMM2_Da = scanline[2];
          in_XMM3_Da = *scanline;
          in_XMM4_Da = scanline[1];
        }
        fVar12 = in_XMM4_Da;
        if (in_XMM4_Da <= in_XMM2_Da) {
          fVar12 = in_XMM2_Da;
        }
        fVar13 = in_XMM3_Da;
        if (in_XMM3_Da <= fVar12) {
          fVar13 = fVar12;
        }
        if (1e-32 <= fVar13) {
          _fStack_60 = CONCAT44(scanlineheader,in_XMM4_Da);
          local_78 = (uchar *)CONCAT44(local_78._4_4_,fVar13);
          fVar12 = frexpf(fVar13,(int *)local_90);
          fVar12 = (fVar12 * 256.0) / local_78._0_4_;
          local_34 = CONCAT13(local_90[0] + -0x80,
                              CONCAT12((char)(int)(fVar12 * in_XMM2_Da),
                                       CONCAT11((char)(int)(fStack_60 * fVar12),
                                                (char)(int)(in_XMM3_Da * fVar12))));
          uVar9 = local_80;
          in_XMM4_Da = fStack_60;
        }
        else {
          local_34 = 0;
        }
        local_70[uVar10] = (uchar)local_34;
        scratch[uVar10 + uVar5] = local_34._1_1_;
        scratch[uVar10 + (uint)(width * 2)] = local_34._2_1_;
        scratch[uVar10 + (uint)(width * 3)] = local_34._3_1_;
        uVar10 = uVar10 + 1;
        scanline = scanline + comp;
      } while (uVar9 != uVar10);
    }
    fwrite(&local_64,4,1,local_88);
    lVar3 = uVar9 - 3;
    puVar4 = local_70 + 2;
    local_58 = 0;
    local_78 = local_70;
    _fStack_60 = lVar3;
    do {
      puVar1 = local_70;
      if (0 < width) {
        lVar6 = local_58 * local_80;
        iVar11 = 0;
        do {
          f_01 = local_88;
          f_00 = local_88;
          iVar8 = width;
          if (iVar11 + 2 < width) {
            lVar2 = (long)iVar11 + -1;
            iVar7 = iVar11;
            do {
              if ((puVar4[lVar2 + -1] == puVar4[lVar2]) &&
                 (iVar8 = iVar7, puVar4[lVar2 + -1] == puVar4[lVar2 + 1])) break;
              iVar7 = iVar7 + 1;
              lVar2 = lVar2 + 1;
              iVar8 = width;
            } while (lVar2 < lVar3);
          }
          for (; local_88 = f_00, iVar11 < iVar8; iVar11 = iVar11 + iVar7) {
            iVar7 = iVar8 - iVar11;
            if (0x7f < iVar8 - iVar11) {
              iVar7 = 0x80;
            }
            stbiw__write_dump_data((FILE *)f_01,iVar7,puVar1 + iVar11 + lVar6);
            f_00 = local_88;
          }
          if (iVar8 + 2 < width) {
            lVar3 = (long)iVar8;
            iVar7 = iVar8 + 1;
            if (iVar8 + 1 < width) {
              iVar7 = width;
            }
            do {
              if (local_78[lVar3] != puVar1[iVar11 + lVar6]) {
                iVar7 = (int)lVar3;
                break;
              }
              lVar3 = lVar3 + 1;
            } while (lVar3 < (long)local_80);
            for (; iVar11 < iVar7; iVar11 = iVar11 + iVar8) {
              iVar8 = iVar7 - iVar11;
              if (0x7e < iVar7 - iVar11) {
                iVar8 = 0x7f;
              }
              stbiw__write_run_data((FILE *)f_00,iVar8,puVar1[iVar11 + lVar6]);
            }
          }
          lVar3 = _fStack_60;
        } while (iVar11 < width);
      }
      local_58 = local_58 + 1;
      puVar4 = puVar4 + local_80;
      local_78 = local_78 + local_80;
    } while (local_58 != 4);
  }
  return;
}

Assistant:

void stbiw__write_hdr_scanline(FILE *f, int width, int comp, unsigned char *scratch, const float *scanline)
{
   unsigned char scanlineheader[4] = { 2, 2, 0, 0 };
   unsigned char rgbe[4];
   float linear[3];
   int x;

   scanlineheader[2] = (width&0xff00)>>8;
   scanlineheader[3] = (width&0x00ff);

   /* skip RLE for images too small or large */
   if (width < 8 || width >= 32768) {
      for (x=0; x < width; x++) {
         switch (comp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*comp + 2];
                    linear[1] = scanline[x*comp + 1];
                    linear[0] = scanline[x*comp + 0];
                    break;
            case 2: /* fallthrough */
            case 1: linear[0] = linear[1] = linear[2] = scanline[x*comp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         fwrite(rgbe, 4, 1, f);
      }
   } else {
      int c,r;
      /* encode into scratch buffer */
      for (x=0; x < width; x++) {
         switch(comp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*comp + 2];
                    linear[1] = scanline[x*comp + 1];
                    linear[0] = scanline[x*comp + 0];
                    break;
            case 2: /* fallthrough */
            case 1: linear[0] = linear[1] = linear[2] = scanline[x*comp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         scratch[x + width*0] = rgbe[0];
         scratch[x + width*1] = rgbe[1];
         scratch[x + width*2] = rgbe[2];
         scratch[x + width*3] = rgbe[3];
      }

      fwrite(scanlineheader, 4, 1, f);

      /* RLE each component separately */
      for (c=0; c < 4; c++) {
         unsigned char *comp = &scratch[width*c];

         x = 0;
         while (x < width) {
            // find first run
            r = x;
            while (r+2 < width) {
               if (comp[r] == comp[r+1] && comp[r] == comp[r+2])
                  break;
               ++r;
            }
            if (r+2 >= width)
               r = width;
            // dump up to first run
            while (x < r) {
               int len = r-x;
               if (len > 128) len = 128;
               stbiw__write_dump_data(f, len, &comp[x]);
               x += len;
            }
            // if there's a run, output it
            if (r+2 < width) { // same test as what we break out of in search loop, so only true if we break'd
               // find next byte after run
               while (r < width && comp[r] == comp[x])
                  ++r;
               // output run up to r
               while (x < r) {
                  int len = r-x;
                  if (len > 127) len = 127;
                  stbiw__write_run_data(f, len, comp[x]);
                  x += len;
               }
            }
         }
      }
   }
}